

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_gen_image_gradient_radial_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,float density,rf_color inner,
          rf_color outer,rf_color *dst,rf_int dst_size)

{
  long lVar1;
  int iVar2;
  long lVar3;
  uchar *puVar4;
  float fVar5;
  float fVar6;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (width * height * 4 <= dst_size) {
    if (0 < height) {
      iVar2 = height;
      if (width < height) {
        iVar2 = width;
      }
      puVar4 = &dst->a;
      lVar1 = 0;
      do {
        if (0 < width) {
          lVar3 = 0;
          do {
            fVar5 = hypotf((float)lVar3 - (float)width * 0.5,(float)lVar1 - (float)height * 0.5);
            fVar5 = (fVar5 + -((float)iVar2 * 0.5) * density) /
                    ((1.0 - density) * (float)iVar2 * 0.5);
            if (fVar5 <= 0.0) {
              fVar5 = 0.0;
            }
            if (1.0 <= fVar5) {
              fVar5 = 1.0;
            }
            fVar6 = 1.0 - fVar5;
            puVar4[lVar3 * 4 + -3] =
                 (uchar)(int)((float)((uint)outer & 0xff) * fVar5 +
                             fVar6 * (float)((uint)inner & 0xff));
            puVar4[lVar3 * 4 + -2] =
                 (uchar)(int)((float)((uint)outer >> 8 & 0xff) * fVar5 +
                             fVar6 * (float)((uint)inner >> 8 & 0xff));
            puVar4[lVar3 * 4 + -1] =
                 (uchar)(int)((float)((uint)outer >> 0x10 & 0xff) * fVar5 +
                             fVar6 * (float)((uint)inner >> 0x10 & 0xff));
            puVar4[lVar3 * 4] =
                 (uchar)(int)(fVar5 * (float)((uint)outer >> 0x18) +
                             fVar6 * (float)((uint)inner >> 0x18));
            lVar3 = lVar3 + 1;
          } while (width != lVar3);
        }
        lVar1 = lVar1 + 1;
        puVar4 = puVar4 + (long)width * 4;
      } while (lVar1 != height);
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_radial_to_buffer(int width, int height, float density, rf_color inner, rf_color outer, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        float radius = (width < height) ? ((float)width) / 2.0f : ((float)height) / 2.0f;

        float center_x = ((float)width ) / 2.0f;
        float center_y = ((float)height) / 2.0f;

        for (rf_int y = 0; y < height; y++)
        {
            for (rf_int x = 0; x < width; x++)
            {
                float dist   = hypotf((float)x - center_x, (float)y - center_y);
                float factor = (dist - radius * density) / (radius * (1.0f - density));

                factor = (float)fmax(factor, 0.f);
                factor = (float)fmin(factor, 1.f); // dist can be bigger than radius so we have to check

                dst[y * width + x].r = (int)((float)outer.r * factor + (float)inner.r * (1.0f - factor));
                dst[y * width + x].g = (int)((float)outer.g * factor + (float)inner.g * (1.0f - factor));
                dst[y * width + x].b = (int)((float)outer.b * factor + (float)inner.b * (1.0f - factor));
                dst[y * width + x].a = (int)((float)outer.a * factor + (float)inner.a * (1.0f - factor));
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}